

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringlistmodel.cpp
# Opt level: O3

bool __thiscall
QStringListModel::setItemData(QStringListModel *this,QModelIndex *index,QMap<int,_QVariant> *roles)

{
  QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
  *pQVar1;
  undefined1 uVar2;
  _Rb_tree_node_base *p_Var3;
  const_iterator cVar4;
  const_iterator cVar5;
  _Rb_tree_header *p_Var6;
  long in_FS_OFFSET;
  int local_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (roles->d).d.ptr;
  if ((pQVar1 == (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                  *)0x0) || ((pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) {
LAB_0048fb3d:
    uVar2 = 0;
  }
  else {
    p_Var3 = *(_Base_ptr *)((long)&(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
    p_Var6 = &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var3 == p_Var6) {
LAB_0048fb38:
      if ((_Rb_tree_header *)p_Var3 != p_Var6) goto LAB_0048fb3d;
    }
    else {
      do {
        if ((p_Var3[1]._M_color & 0xfffffffd) != _S_red) goto LAB_0048fb38;
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
      } while ((_Rb_tree_header *)p_Var3 != p_Var6);
    }
    local_2c = 2;
    cVar4._M_node = (_Base_ptr)QMap<int,_QVariant>::find(roles,&local_2c);
    pQVar1 = (roles->d).d.ptr;
    cVar5._M_node = &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header;
    if (pQVar1 == (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                   *)0x0) {
      cVar5._M_node = (_Base_ptr)0x0;
    }
    if (cVar4._M_node == cVar5._M_node) {
      local_2c = 0;
      cVar4._M_node = (_Base_ptr)QMap<int,_QVariant>::find(roles,&local_2c);
    }
    uVar2 = (**(code **)(*(long *)this + 0x98))
                      (this,index,&cVar4._M_node[1]._M_parent,cVar4._M_node[1]._M_color);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return (bool)uVar2;
}

Assistant:

bool QStringListModel::setItemData(const QModelIndex &index, const QMap<int, QVariant> &roles)
{
    if (roles.isEmpty())
        return false;
    if (std::any_of(roles.keyBegin(), roles.keyEnd(), [](int role) -> bool {
        return role != Qt::DisplayRole && role != Qt::EditRole;
    })) {
        return false;
    }
    auto roleIter = roles.constFind(Qt::EditRole);
    if (roleIter == roles.constEnd())
        roleIter = roles.constFind(Qt::DisplayRole);
    Q_ASSERT(roleIter != roles.constEnd());
    return setData(index, roleIter.value(), roleIter.key());
}